

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O0

void borg_flow_border(int y1,int x1,int y2,int x2,_Bool stop)

{
  int local_24;
  int local_20;
  int y;
  int x;
  _Bool stop_local;
  int x2_local;
  int y2_local;
  int x1_local;
  int y1_local;
  
  for (local_24 = y1; local_20 = x1, local_24 <= y2; local_24 = local_24 + 1) {
    borg_data_know->data[local_24][x1] = stop;
    borg_data_icky->data[local_24][x1] = stop;
    borg_data_know->data[local_24][x2] = stop;
    borg_data_icky->data[local_24][x2] = stop;
  }
  for (; local_20 <= x2; local_20 = local_20 + 1) {
    borg_data_know->data[y1][local_20] = stop;
    borg_data_icky->data[y1][local_20] = stop;
    borg_data_know->data[y2][local_20] = stop;
    borg_data_icky->data[y2][local_20] = stop;
  }
  return;
}

Assistant:

static void borg_flow_border(int y1, int x1, int y2, int x2, bool stop)
{
    int x, y;

    /* Scan west/east edges */
    for (y = y1; y <= y2; y++) {
        /* Avoid/Clear west edge */
        borg_data_know->data[y][x1] = stop;
        borg_data_icky->data[y][x1] = stop;

        /* Avoid/Clear east edge */
        borg_data_know->data[y][x2] = stop;
        borg_data_icky->data[y][x2] = stop;
    }

    /* Scan north/south edges */
    for (x = x1; x <= x2; x++) {
        /* Avoid/Clear north edge */
        borg_data_know->data[y1][x] = stop;
        borg_data_icky->data[y1][x] = stop;

        /* Avoid/Clear south edge */
        borg_data_know->data[y2][x] = stop;
        borg_data_icky->data[y2][x] = stop;
    }
}